

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

uint LinearScan::GetUseSpillCost(uint loopNest,BOOL isInHelperBlock)

{
  uint uVar1;
  
  uVar1 = 0;
  if (isInHelperBlock == 0) {
    if (loopNest < 6) {
      uVar1 = 1 << ((char)loopNest * '\x03' & 0x1fU);
    }
    else {
      uVar1 = loopNest * 0x8000 - 0x28000;
    }
  }
  return uVar1;
}

Assistant:

uint
LinearScan::GetUseSpillCost(uint loopNest, BOOL isInHelperBlock)
{
    if (isInHelperBlock)
    {
        // Helper block uses are not as important.
        return 0;
    }
    else if (loopNest < 6)
    {
        return (1 << (loopNest * 3));
    }
    else
    {
        // Slow growth for deep nest to avoid overflow
        return (1 << (5 * 3)) * (loopNest-5);
    }
}